

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu_features.c
# Opt level: O3

void cpu_check_features(cpu_features *features)

{
  (features->x86).has_pclmulqdq = 0;
  (features->x86).has_vpclmulqdq = 0;
  (features->x86).has_os_save_ymm = 0;
  (features->x86).has_os_save_zmm = 0;
  (features->x86).has_sse2 = 0;
  (features->x86).has_ssse3 = 0;
  (features->x86).has_sse42 = 0;
  (features->x86).has_pclmulqdq = 0;
  (features->x86).has_avx512vl = 0;
  (features->x86).has_avx512_common = 0;
  (features->x86).has_avx512vnni = 0;
  (features->x86).has_bmi2 = 0;
  (features->x86).has_avx2 = 0;
  (features->x86).has_avx512f = 0;
  (features->x86).has_avx512dq = 0;
  (features->x86).has_avx512bw = 0;
  x86_check_features(&features->x86);
  return;
}

Assistant:

Z_INTERNAL void cpu_check_features(struct cpu_features *features) {
    memset(features, 0, sizeof(struct cpu_features));
#if defined(X86_FEATURES)
    x86_check_features(&features->x86);
#elif defined(ARM_FEATURES)
    arm_check_features(&features->arm);
#elif defined(PPC_FEATURES) || defined(POWER_FEATURES)
    power_check_features(&features->power);
#elif defined(S390_FEATURES)
    s390_check_features(&features->s390);
#elif defined(RISCV_FEATURES)
    riscv_check_features(&features->riscv);
#endif
}